

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# writer.hpp
# Opt level: O3

void __thiscall lightconf::writer::newline(writer *this)

{
  _Elt_pointer piVar1;
  undefined1 *local_30;
  int local_28;
  undefined1 local_20 [16];
  
  local_30 = local_20;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_30,"\n","");
  std::__cxx11::string::_M_append((char *)this,(ulong)local_30);
  this->col = this->col + local_28;
  if (local_30 != local_20) {
    operator_delete(local_30);
  }
  piVar1 = (this->tabstops).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
           super__Deque_impl_data._M_finish._M_cur;
  if (piVar1 == (this->tabstops).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
                super__Deque_impl_data._M_finish._M_first) {
    piVar1 = (this->tabstops).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
             super__Deque_impl_data._M_finish._M_node[-1] + 0x80;
  }
  local_30 = local_20;
  std::__cxx11::string::_M_construct((ulong)&local_30,(char)piVar1[-1]);
  std::__cxx11::string::_M_append((char *)this,(ulong)local_30);
  this->col = this->col + local_28;
  if (local_30 != local_20) {
    operator_delete(local_30);
  }
  this->line = this->line + 1;
  piVar1 = (this->tabstops).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
           super__Deque_impl_data._M_finish._M_cur;
  if (piVar1 == (this->tabstops).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
                super__Deque_impl_data._M_finish._M_first) {
    piVar1 = (this->tabstops).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
             super__Deque_impl_data._M_finish._M_node[-1] + 0x80;
  }
  this->col = piVar1[-1];
  return;
}

Assistant:

void writer::newline() {
    append("\n");
    append(std::string(tabstops.top(), ' '));
    line++;
    col = tabstops.top();
}